

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O1

void __thiscall
fasttext::DenseMatrix::addVectorToRow(DenseMatrix *this,Vector *vec,int64_t i,real a)

{
  pointer pfVar1;
  long lVar2;
  pointer pfVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 in_register_00001204 [12];
  
  if (i < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/densematrix.cc"
                  ,0x76,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  if (i < (this->super_Matrix).m_) {
    pfVar1 = (vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar2 = (this->super_Matrix).n_;
    if ((long)(vec->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pfVar1 >> 2 == lVar2) {
      if (0 < lVar2) {
        pfVar3 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar5 = 0;
        do {
          auVar4._4_12_ = in_register_00001204;
          auVar4._0_4_ = a;
          auVar4 = vfmadd213ss_fma(ZEXT416((uint)pfVar1[lVar5]),auVar4,
                                   ZEXT416((uint)pfVar3[i * lVar2 + lVar5]));
          pfVar3[i * lVar2 + lVar5] = auVar4._0_4_;
          lVar5 = lVar5 + 1;
        } while (lVar2 != lVar5);
      }
      return;
    }
    __assert_fail("vec.size() == n_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/densematrix.cc"
                  ,0x78,
                  "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)"
                 );
  }
  __assert_fail("i < m_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/asd5510[P]fastText-chinese-word2vec-optimization/src/densematrix.cc"
                ,0x77,
                "virtual void fasttext::DenseMatrix::addVectorToRow(const Vector &, int64_t, real)")
  ;
}

Assistant:

void DenseMatrix::addVectorToRow(const Vector& vec, int64_t i, real a) {
  assert(i >= 0);
  assert(i < m_);
  assert(vec.size() == n_);
  for (int64_t j = 0; j < n_; j++) {
    data_[i * n_ + j] += a * vec[j];
  }
}